

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::
vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::clear(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this)

{
  long *plVar1;
  ulong uVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  
  uVar2 = this->nStored;
  if (uVar2 != 0) {
    lVar4 = 0x10;
    uVar5 = 0;
    do {
      plVar1 = *(long **)((long)this->ptr + lVar4 + -0x10);
      plVar3 = (long *)((long)&(this->ptr->_M_dataplus)._M_p + lVar4);
      if (plVar3 != plVar1) {
        operator_delete(plVar1,*plVar3 + 1);
        uVar2 = this->nStored;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x20;
    } while (uVar5 < uVar2);
  }
  this->nStored = 0;
  return;
}

Assistant:

void clear() {
        for (int i = 0; i < nStored; ++i)
            alloc.destroy(&ptr[i]);
        nStored = 0;
    }